

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertCstrNoCaseContains
          (UtestShell *this,char *expected,char *actual,char *text,char *fileName,size_t lineNumber)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  TestResult *pTVar4;
  SimpleString local_198;
  SimpleString local_188;
  SimpleString local_178;
  ContainsFailure local_168;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0 [2];
  SimpleString local_c0;
  SimpleString local_b0;
  ContainsFailure local_a0;
  size_t local_38;
  size_t lineNumber_local;
  char *fileName_local;
  char *text_local;
  char *actual_local;
  char *expected_local;
  UtestShell *this_local;
  
  local_38 = lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = text;
  text_local = actual;
  actual_local = expected;
  expected_local = (char *)this;
  pTVar4 = getTestResult(this);
  (*pTVar4->_vptr_TestResult[10])();
  sVar2 = lineNumber_local;
  sVar1 = local_38;
  if ((text_local != (char *)0x0) || (actual_local != (char *)0x0)) {
    if ((text_local == (char *)0x0) || (actual_local == (char *)0x0)) {
      SimpleString::SimpleString(&local_b0,actual_local);
      SimpleString::SimpleString(&local_c0,text_local);
      SimpleString::SimpleString(local_e0,fileName_local);
      ContainsFailure::ContainsFailure
                (&local_a0,this,(char *)sVar2,sVar1,&local_b0,&local_c0,local_e0);
      (*this->_vptr_UtestShell[0x26])(this,&local_a0);
      ContainsFailure::~ContainsFailure(&local_a0);
      SimpleString::~SimpleString(local_e0);
      SimpleString::~SimpleString(&local_c0);
      SimpleString::~SimpleString(&local_b0);
    }
    SimpleString::SimpleString(&local_f0,text_local);
    SimpleString::SimpleString(&local_100,actual_local);
    bVar3 = SimpleString::containsNoCase(&local_f0,&local_100);
    SimpleString::~SimpleString(&local_100);
    SimpleString::~SimpleString(&local_f0);
    sVar2 = lineNumber_local;
    sVar1 = local_38;
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      SimpleString::SimpleString(&local_178,actual_local);
      SimpleString::SimpleString(&local_188,text_local);
      SimpleString::SimpleString(&local_198,fileName_local);
      ContainsFailure::ContainsFailure
                (&local_168,this,(char *)sVar2,sVar1,&local_178,&local_188,&local_198);
      (*this->_vptr_UtestShell[0x26])(this,&local_168);
      ContainsFailure::~ContainsFailure(&local_168);
      SimpleString::~SimpleString(&local_198);
      SimpleString::~SimpleString(&local_188);
      SimpleString::~SimpleString(&local_178);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrNoCaseContains(const char* expected, const char* actual, const char* text, const char* fileName, size_t lineNumber)
{
    getTestResult()->countCheck();
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(ContainsFailure(this, fileName, lineNumber, expected, actual, text));
    if (!SimpleString(actual).containsNoCase(expected))
        failWith(ContainsFailure(this, fileName, lineNumber, expected, actual, text));
}